

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pose2texture.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  float *pfVar1;
  uint uVar2;
  char cVar3;
  int iVar4;
  uint uVar5;
  ostream *poVar6;
  basic_ostream<char,_std::char_traits<char>_> *pbVar7;
  long lVar8;
  char *pcVar9;
  int row;
  long lVar10;
  ulong uVar11;
  uint uVar12;
  long lVar13;
  int row_1;
  int iVar14;
  char **ppcVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  uint uVar19;
  uint uVar21;
  undefined1 auVar20 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  allocator local_451;
  ulong local_450;
  char **local_448;
  Vec3b vui;
  vector<cv::Mat,_std::allocator<cv::Mat>_> tiles;
  Vec3b pixsrc;
  undefined8 local_3d4;
  int option_index;
  path teximpath;
  path vuiimpath;
  path vuipath;
  Mat texture;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_358 [3];
  long *local_320;
  Mat vuisrc;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2f8 [3];
  uint *local_2c8;
  long *local_2c0;
  path bgrimbasename;
  Vec4f texsrc;
  undefined8 local_118;
  path bgrimpath;
  Mat cumul;
  long local_e0;
  long *local_a8;
  Mat imgsrc;
  Size local_80;
  long *local_48;
  
  vuipath.m_pathname._M_dataplus._M_p = (pointer)&vuipath.m_pathname.field_2;
  vuipath.m_pathname._M_string_length = 0;
  vuipath.m_pathname.field_2._M_local_buf[0] = '\0';
  option_index = 0;
  local_448 = argv;
  do {
    while( true ) {
      iVar4 = getopt_long(argc,local_448,"hv:i:",long_options,&option_index);
      if (iVar4 != 0x69) break;
      boost::filesystem::path::path((path *)&texsrc,_optarg);
      std::__cxx11::string::operator=((string *)&vuipath,(string *)&texsrc);
      std::__cxx11::string::~string((string *)&texsrc);
    }
  } while (iVar4 != -1);
  poVar6 = std::operator<<((ostream *)&std::cout,"vui-folder: ");
  pbVar7 = boost::filesystem::operator<<
                     ((basic_ostream<char,_std::char_traits<char>_> *)poVar6,&vuipath);
  std::endl<char,std::char_traits<char>>((ostream *)pbVar7);
  local_118 = 0x4b000000320;
  cv::Matx<double,_4,_1>::Matx((Matx<double,_4,_1> *)&texsrc);
  texsrc.super_Matx<float,_4,_1>.val[0] = 0.0;
  texsrc.super_Matx<float,_4,_1>.val[1] = 0.0;
  texsrc.super_Matx<float,_4,_1>.val[2] = 0.0;
  texsrc.super_Matx<float,_4,_1>.val[3] = 0.0;
  cv::Mat::Mat(&cumul,&local_118,0x1d,(Matx<double,_4,_1> *)&texsrc);
  lVar10 = (long)_optind;
  ppcVar15 = local_448;
  do {
    if (argc <= lVar10) {
      for (lVar10 = 0; lVar10 != 0x4b0; lVar10 = lVar10 + 1) {
        for (lVar8 = 0; lVar8 != 0x3200; lVar8 = lVar8 + 0x10) {
          cv::Matx<float,_4,_1>::Matx
                    (&texsrc.super_Matx<float,_4,_1>,
                     (float *)(*local_a8 * lVar10 + local_e0 + lVar8));
          auVar17._8_8_ = 0;
          auVar17._0_4_ = texsrc.super_Matx<float,_4,_1>.val[0];
          auVar17._4_4_ = texsrc.super_Matx<float,_4,_1>.val[1];
          auVar23._4_4_ = texsrc.super_Matx<float,_4,_1>.val[3];
          auVar23._0_4_ = texsrc.super_Matx<float,_4,_1>.val[3];
          auVar23._8_8_ = 0;
          auVar17 = divps(auVar17,auVar23);
          texsrc.super_Matx<float,_4,_1>.val._0_8_ = auVar17._0_8_;
          texsrc.super_Matx<float,_4,_1>.val._8_8_ =
               CONCAT44(-(uint)(texsrc.super_Matx<float,_4,_1>.val[3] != 0.0),
                        texsrc.super_Matx<float,_4,_1>.val[2] /
                        texsrc.super_Matx<float,_4,_1>.val[3]) & 0x437f0000ffffffff;
          pfVar1 = (float *)(lVar8 + *local_a8 * lVar10 + local_e0);
          *(undefined8 *)pfVar1 = texsrc.super_Matx<float,_4,_1>.val._0_8_;
          *(undefined8 *)(pfVar1 + 2) = texsrc.super_Matx<float,_4,_1>.val._8_8_;
        }
      }
      std::__cxx11::string::string((string *)&texsrc,"cumul.png",(allocator *)&texture);
      _imgsrc = 0x1010000;
      _vuisrc = (pointer)0x0;
      cv::imwrite((string *)&texsrc,(_InputArray *)&imgsrc,(vector *)&vuisrc);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&vuisrc);
      std::__cxx11::string::~string((string *)&texsrc);
      cv::Mat::~Mat(&cumul);
      std::__cxx11::string::~string((string *)&vuipath);
      return 0;
    }
    boost::filesystem::path::path(&bgrimpath,ppcVar15[lVar10]);
    boost::filesystem::basename_abi_cxx11_((char *)&texsrc);
    std::__cxx11::string::string((string *)&bgrimbasename,(string *)&texsrc);
    std::__cxx11::string::~string((string *)&texsrc);
    lVar8 = std::__cxx11::string::find((char *)&bgrimbasename,0x1040c2);
    if (lVar8 == -1) {
      lVar8 = std::__cxx11::string::find((char *)&bgrimbasename,0x1040e1);
      if (lVar8 != -1) {
        pcVar9 = basename(*ppcVar15);
        poVar6 = std::operator<<((ostream *)&std::cerr,pcVar9);
        pcVar9 = ": skipping _IUV file  \'";
        goto LAB_001026b6;
      }
      std::__cxx11::string::string((string *)&texsrc,ppcVar15[lVar10],(allocator *)&vuisrc);
      cv::imread((string *)&imgsrc,(int)(string *)&texsrc);
      std::__cxx11::string::~string((string *)&texsrc);
      cVar3 = cv::Mat::empty();
      if (cVar3 == '\0') {
        if ((_imgsrc & 0xff8) != 0x10) {
          pcVar9 = basename(*ppcVar15);
          poVar6 = std::operator<<((ostream *)&std::cerr,pcVar9);
          pcVar9 = ": image file is not RGB \'";
          goto LAB_0010290d;
        }
        poVar6 = std::operator<<((ostream *)&std::cout,"processing: ");
        std::__cxx11::string::string((string *)&texsrc,ppcVar15[lVar10],(allocator *)&vuisrc);
        poVar6 = std::operator<<(poVar6,(string *)&texsrc);
        std::endl<char,std::char_traits<char>>(poVar6);
        std::__cxx11::string::~string((string *)&texsrc);
        std::__cxx11::string::string((string *)&texture,"_IUV.png",(allocator *)&teximpath);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vuisrc,
                       &bgrimbasename.m_pathname,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&texture
                      );
        std::__cxx11::string::string((string *)&texsrc,(string *)&vuisrc);
        boost::filesystem::operator/(&vuiimpath,&vuipath,(path *)&texsrc);
        std::__cxx11::string::~string((string *)&texsrc);
        std::__cxx11::string::~string((string *)&vuisrc);
        std::__cxx11::string::~string((string *)&texture);
        poVar6 = std::operator<<((ostream *)&std::cout,"\t- ");
        pbVar7 = boost::filesystem::operator<<
                           ((basic_ostream<char,_std::char_traits<char>_> *)poVar6,&vuiimpath);
        std::endl<char,std::char_traits<char>>((ostream *)pbVar7);
        std::__cxx11::string::string
                  ((string *)&texsrc,vuiimpath.m_pathname._M_dataplus._M_p,(allocator *)&texture);
        cv::imread((string *)&vuisrc,(int)(string *)&texsrc);
        std::__cxx11::string::~string((string *)&texsrc);
        cVar3 = cv::Mat::empty();
        if (cVar3 == '\0') {
          if ((_vuisrc & 0xff8) != 0x10) {
            pcVar9 = basename(*ppcVar15);
            poVar6 = std::operator<<((ostream *)&std::cerr,pcVar9);
            pcVar9 = ": image file is not RGB \'";
            goto LAB_00102ad4;
          }
          local_450 = (ulong)*local_2c8;
          uVar2 = local_2c8[1];
          std::__cxx11::string::string((string *)&texture,"_TEX.png",(allocator *)&tiles);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &texsrc,&bgrimbasename.m_pathname,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &texture);
          std::__cxx11::string::string((string *)&teximpath,(string *)&texsrc);
          std::__cxx11::string::~string((string *)&texsrc);
          std::__cxx11::string::~string((string *)&texture);
          poVar6 = std::operator<<((ostream *)&std::cout,"\t- ");
          pbVar7 = boost::filesystem::operator<<
                             ((basic_ostream<char,_std::char_traits<char>_> *)poVar6,&teximpath);
          std::endl<char,std::char_traits<char>>((ostream *)pbVar7);
          local_3d4 = 0x4b000000320;
          cv::Matx<double,_4,_1>::Matx((Matx<double,_4,_1> *)&texsrc);
          texsrc.super_Matx<float,_4,_1>.val[0] = 0.0;
          texsrc.super_Matx<float,_4,_1>.val[1] = 0.0;
          texsrc.super_Matx<float,_4,_1>.val[2] = 0.0;
          texsrc.super_Matx<float,_4,_1>.val[3] = 0.0;
          cv::Mat::Mat(&texture,&local_3d4,0x1d,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&texsrc)
          ;
          tiles.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          tiles.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          tiles.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          for (iVar4 = 0; iVar4 != 4; iVar4 = iVar4 + 1) {
            for (iVar14 = 0; iVar14 != 0x4b0; iVar14 = iVar14 + 200) {
              _vui = iVar4 * 200;
              cv::Mat::Mat((Mat *)&texsrc,&texture,(Rect_ *)&vui);
              std::vector<cv::Mat,_std::allocator<cv::Mat>_>::emplace_back<cv::Mat>
                        (&tiles,(Mat *)&texsrc);
              cv::Mat::~Mat((Mat *)&texsrc);
            }
          }
          if ((int)uVar2 < 1) {
            uVar2 = 0;
          }
          iVar4 = (int)local_450;
          local_450 = local_450 & 0xffffffff;
          if (iVar4 < 1) {
            local_450 = 0;
          }
          for (uVar11 = 0; uVar11 != local_450; uVar11 = uVar11 + 1) {
            for (lVar8 = 0; (ulong)uVar2 * 3 != lVar8; lVar8 = lVar8 + 3) {
              cv::Matx<unsigned_char,_3,_1>::Matx
                        (&vui.super_Matx<unsigned_char,_3,_1>,
                         (uchar *)(*local_2c0 * uVar11 + local_2f8[0]._M_allocated_capacity + lVar8)
                        );
              uVar12 = _vui & 0x1f;
              iVar4 = uVar12 - 1;
              auVar16._0_8_ = (double)(_vui >> 8 & 0xff) * 199.0;
              auVar16._8_8_ = (255.0 - (double)(_vui >> 0x10 & 0xff)) * 199.0;
              auVar17 = divpd(auVar16,_DAT_00104030);
              if ((byte)iVar4 < 0x18) {
                uVar19 = (uint)auVar17._0_8_;
                uVar21 = (uint)auVar17._8_8_;
                auVar18._0_4_ = -(uint)(-0x7fffff39 < (int)(uVar19 ^ 0x80000000));
                auVar18._4_4_ = -(uint)(-0x7fffff39 < (int)(uVar19 ^ 0x80000000));
                auVar18._8_4_ = -(uint)(-0x7fffff39 < (int)(uVar21 ^ 0x80000000));
                auVar18._12_4_ = -(uint)(-0x7fffff39 < (int)(uVar21 ^ 0x80000000));
                uVar5 = movmskpd(iVar4,auVar18);
                if (((byte)((byte)(uVar5 ^ 3) >> 1) != 0) && (((uVar5 ^ 3) & 1) != 0)) {
                  cv::Matx<unsigned_char,_3,_1>::Matx
                            (&pixsrc.super_Matx<unsigned_char,_3,_1>,
                             (uchar *)(*local_48 * uVar11 + (long)local_80 + lVar8));
                  lVar13 = (ulong)(uVar12 - 1) * 0x60;
                  cv::Matx<float,_4,_1>::Matx
                            (&texsrc.super_Matx<float,_4,_1>,
                             (float *)(**(long **)(tiles.
                                                  super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>
                                                  ._M_impl.super__Vector_impl_data._M_start +
                                                  lVar13 + 0x48) * (ulong)uVar21 +
                                       *(long *)(tiles.
                                                 super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>
                                                 ._M_impl.super__Vector_impl_data._M_start +
                                                lVar13 + 0x10) + (ulong)uVar19 * 0x10));
                  texsrc.super_Matx<float,_4,_1>.val[1] =
                       (float)(pixsrc.super_Matx<unsigned_char,_3,_1>.val._1_2_ & 0xff) +
                       texsrc.super_Matx<float,_4,_1>.val[1];
                  texsrc.super_Matx<float,_4,_1>.val[0] =
                       (float)pixsrc.super_Matx<unsigned_char,_3,_1>.val[0] +
                       texsrc.super_Matx<float,_4,_1>.val[0];
                  texsrc.super_Matx<float,_4,_1>.val[3] =
                       texsrc.super_Matx<float,_4,_1>.val[3] + 1.0;
                  texsrc.super_Matx<float,_4,_1>.val[2] =
                       (float)(byte)((ulong)_pixsrc >> 0x10) + texsrc.super_Matx<float,_4,_1>.val[2]
                  ;
                  pfVar1 = (float *)((ulong)uVar19 * 0x10 +
                                    (ulong)uVar21 *
                                    **(long **)(tiles.
                                                super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>
                                                ._M_impl.super__Vector_impl_data._M_start +
                                               lVar13 + 0x48) +
                                    *(long *)(tiles.
                                              super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>.
                                              _M_impl.super__Vector_impl_data._M_start +
                                             lVar13 + 0x10));
                  *(undefined8 *)pfVar1 = texsrc.super_Matx<float,_4,_1>.val._0_8_;
                  *(undefined8 *)(pfVar1 + 2) = texsrc.super_Matx<float,_4,_1>.val._8_8_;
                }
              }
            }
          }
          cv::operator+((Mat *)&texsrc,&cumul);
          (**(code **)(*(long *)texsrc.super_Matx<float,_4,_1>.val._0_8_ + 0x18))
                    (texsrc.super_Matx<float,_4,_1>.val._0_8_,(Mat *)&texsrc,&cumul,
                     0xffffffffffffffff);
          ppcVar15 = local_448;
          cv::MatExpr::~MatExpr((MatExpr *)&texsrc);
          for (lVar8 = 0; lVar8 != 0x4b0; lVar8 = lVar8 + 1) {
            for (lVar13 = 0; lVar13 != 0x3200; lVar13 = lVar13 + 0x10) {
              cv::Matx<float,_4,_1>::Matx
                        (&texsrc.super_Matx<float,_4,_1>,
                         (float *)(*local_320 * lVar8 + local_358[0]._M_allocated_capacity + lVar13)
                        );
              auVar20._8_8_ = 0;
              auVar20._0_4_ = texsrc.super_Matx<float,_4,_1>.val[0];
              auVar20._4_4_ = texsrc.super_Matx<float,_4,_1>.val[1];
              auVar22._4_4_ = texsrc.super_Matx<float,_4,_1>.val[3];
              auVar22._0_4_ = texsrc.super_Matx<float,_4,_1>.val[3];
              auVar22._8_8_ = 0;
              auVar17 = divps(auVar20,auVar22);
              texsrc.super_Matx<float,_4,_1>.val._0_8_ = auVar17._0_8_;
              texsrc.super_Matx<float,_4,_1>.val._8_8_ =
                   CONCAT44(-(uint)(texsrc.super_Matx<float,_4,_1>.val[3] != 0.0),
                            texsrc.super_Matx<float,_4,_1>.val[2] /
                            texsrc.super_Matx<float,_4,_1>.val[3]) & 0x437f0000ffffffff;
              pfVar1 = (float *)(lVar13 + *local_320 * lVar8 + local_358[0]._M_allocated_capacity);
              *(undefined8 *)pfVar1 = texsrc.super_Matx<float,_4,_1>.val._0_8_;
              *(undefined8 *)(pfVar1 + 2) = texsrc.super_Matx<float,_4,_1>.val._8_8_;
            }
          }
          std::__cxx11::string::string
                    ((string *)&texsrc,teximpath.m_pathname._M_dataplus._M_p,&local_451);
          _vui = 0x1010000;
          _pixsrc = 0;
          cv::imwrite((string *)&texsrc,(_InputArray *)&vui,(vector *)&pixsrc);
          std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                    ((_Vector_base<int,_std::allocator<int>_> *)&pixsrc);
          std::__cxx11::string::~string((string *)&texsrc);
          std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
          std::vector<cv::Mat,_std::allocator<cv::Mat>_>::~vector(&tiles);
          cv::Mat::~Mat(&texture);
          std::__cxx11::string::~string((string *)&teximpath);
        }
        else {
          pcVar9 = basename(*ppcVar15);
          poVar6 = std::operator<<((ostream *)&std::cerr,pcVar9);
          pcVar9 = ": could not open file or invalid image file  \'";
LAB_00102ad4:
          poVar6 = std::operator<<(poVar6,pcVar9);
          pbVar7 = boost::filesystem::operator<<
                             ((basic_ostream<char,_std::char_traits<char>_> *)poVar6,&vuiimpath);
          poVar6 = std::operator<<((ostream *)pbVar7,"\'");
          std::endl<char,std::char_traits<char>>(poVar6);
        }
        cv::Mat::~Mat(&vuisrc);
        std::__cxx11::string::~string((string *)&vuiimpath);
      }
      else {
        pcVar9 = basename(*ppcVar15);
        poVar6 = std::operator<<((ostream *)&std::cerr,pcVar9);
        pcVar9 = ": could not open file or invalid image file  \'";
LAB_0010290d:
        poVar6 = std::operator<<(poVar6,pcVar9);
        poVar6 = std::operator<<(poVar6,ppcVar15[lVar10]);
        poVar6 = std::operator<<(poVar6,"\'");
        std::endl<char,std::char_traits<char>>(poVar6);
      }
      cv::Mat::~Mat(&imgsrc);
    }
    else {
      pcVar9 = basename(*ppcVar15);
      poVar6 = std::operator<<((ostream *)&std::cerr,pcVar9);
      pcVar9 = ": skipping _INDS file  \'";
LAB_001026b6:
      poVar6 = std::operator<<(poVar6,pcVar9);
      poVar6 = std::operator<<(poVar6,ppcVar15[lVar10]);
      poVar6 = std::operator<<(poVar6,"\'");
      std::endl<char,std::char_traits<char>>(poVar6);
    }
    std::__cxx11::string::~string((string *)&bgrimbasename);
    std::__cxx11::string::~string((string *)&bgrimpath);
    lVar10 = lVar10 + 1;
  } while( true );
}

Assistant:

int main(int argc, char** argv )
{
    boost::filesystem::path vuipath;

    int 	option_index = 0;
    while(1) {
        int c = getopt_long (argc, argv, "hv:i:",long_options, &option_index);
        if (c == -1)
            break;  // end of options
        switch (c) {
        case 'v':
            //verbose_level=atoi(optarg);
            break;
        case 'h':
            //usage(cerr,basename(argv[0]));
            //exit(1);
            break;		// never reached
        case 'i':
            // path to _INDS.png and _IUV.png folder
            vuipath=boost::filesystem::path(optarg);
            break;
        }
    }


    cout << "vui-folder: " << vuipath << endl;
    Mat   cumul(Size(800,1200),CV_32FC4,Scalar(0,0,0,0));
    int count=0;

    for(int i=optind; i<argc; i++) {
        boost::filesystem::path bgrimpath(argv[i]);
        boost::filesystem::path bgrimbasename=basename(bgrimpath);
        // skip *_INDS.png, *._IUV.png
        if(string::npos!=bgrimbasename.string().find("_INDS")) {
            cerr << basename(argv[0]) << ": skipping _INDS file  '" << argv[i] << "'" << endl;
            continue;
        }
        if(string::npos!=bgrimbasename.string().find("_IUV")) {
            cerr << basename(argv[0]) << ": skipping _IUV file  '" << argv[i] << "'" << endl;
            continue;
        }

        // read the source image file
        Mat imgsrc=imread(argv[i],1);
        if(imgsrc.empty()) {
            cerr << basename(argv[0]) << ": could not open file or invalid image file  '" << argv[i] << "'" << endl;
            continue;
        }
        if(imgsrc.channels()!=3) {
            cerr << basename(argv[0]) << ": image file is not RGB '" << argv[i] << "'" << endl;
            continue;
        }

        Size srcsize=imgsrc.size();

        cout << "processing: " << string(argv[i]) << endl;

        // get IUV file
        boost::filesystem::path vuiimpath= vuipath / boost::filesystem::path(bgrimbasename.string() + string("_IUV.png"));
        cout << "\t- " << vuiimpath << endl;

        Mat vuisrc=imread(vuiimpath.c_str(),1);
        if(vuisrc.empty()) {
            cerr << basename(argv[0]) << ": could not open file or invalid image file  '" << vuiimpath << "'" << endl;
            continue;
        }
        if(vuisrc.channels()!=3) {
            cerr << basename(argv[0]) << ": image file is not RGB '" << vuiimpath << "'" << endl;
            continue;
        }
        Size vuisize=vuisrc.size();
        /*
        // get INDS file
        boost::filesystem::path indimpath= vuipath / boost::filesystem::path(bgrimbasename.string() + string("_INDS.png"));
        cout << "\t- " << indimpath << endl;

        Mat indsrc=imread(indimpath.c_str(),-1);
        if(indsrc.empty()) {
            cerr << basename(argv[0]) << ": could not open file or invalid image file  '" << indimpath << "'" << endl;
            continue;
        }
        if(indsrc.channels()!=1) {
            cerr << basename(argv[0]) << ": image file is not 1 channel'" << indimpath << "'" << endl;
            continue;
        }
        Size indsize=indsrc.size();

        // get number of different values in ind matrix => should be nb of people seen
        std::vector<unsigned char> unik = unique(indsrc, true);

        for (unsigned int i = 0; i < unik.size(); i++)
            std::cout << (short)unik[i] << " ";
        */
        boost::filesystem::path teximpath= boost::filesystem::path(bgrimbasename.string() + string("_TEX.png"));
        cout << "\t- " << teximpath << endl;



        Mat   texture(Size(800,1200),CV_32FC4,Scalar(0,0,0,0));
        //Mat   texture=imread("SURREAL.png",1);
        //4x6=24 tiles, tile size 200*200
        vector<Mat>  tiles;
        for(int row=0; row<4; row++)
            for(int col=0; col<6; col++)
                tiles.push_back(texture(Rect(200*row,200*col,200,200)));


        //Mat   out=imgsrc;
        //out=Scalar(0,0,0);
        for(int row=0; row<vuisize.height; row++)
            for(int col=0; col<vuisize.width; col++) {
                unsigned int ind=0;
                Vec3b        vui=vuisrc.at<Vec3b>(row,col);

                int i= (unsigned)0x1F & vui[0];
                int u=(255.-float(vui[2]))*199./255.;
                int v=float(vui[1])*199./255.;
                /*
                if((i>0)&&(i<25))
                    if((u>=0)&&(u<200))
                        if((v>=0)&&(v<200))
                out.at<Vec3b>(row,col)=tiles[i-1].at<Vec3b>(u,v);
                */
                if((i>0)&&(i<25))
                    if((u>=0)&&(u<200))
                        if((v>=0)&&(v<200)) {
                            Vec3b pixsrc=imgsrc.at<Vec3b>(row,col); // image pixel
                            Vec4f texsrc=tiles[i-1].at<Vec4f>(u,v);
                            texsrc[0]+=(float)pixsrc[0];
                            texsrc[1]+=(float)pixsrc[1];
                            texsrc[2]+=(float)pixsrc[2];
                            texsrc[3]+=(float)1.0;
                            tiles[i-1].at<Vec4f>(u,v)=texsrc;
                            //tiles[i-1].at<Vec3b>(u,v)=imgsrc.at<Vec3b>(row,col);
                        }
            }
        cumul=cumul+texture;
        count+=1;
        for(int row=0; row<1200; row++)
            for(int col=0; col<800; col++) {
                Vec4f texsrc=texture.at<Vec4f>(row,col);
                texsrc[0]=float(texsrc[0])/float(texsrc[3]);
                texsrc[1]=float(texsrc[1])/float(texsrc[3]);
                texsrc[2]=float(texsrc[2])/float(texsrc[3]);
                texsrc[3]=(float)(texsrc[3] ? 255.0:0.0);
                texture.at<Vec4f>(row,col)=texsrc;
            }
        imwrite(teximpath.c_str(),texture);

        cout << endl;
    }

    for(int row=0; row<1200; row++)
        for(int col=0; col<800; col++) {
            Vec4f texsrc=cumul.at<Vec4f>(row,col);
            texsrc[0]=float(texsrc[0])/float(texsrc[3]);
            texsrc[1]=float(texsrc[1])/float(texsrc[3]);
            texsrc[2]=float(texsrc[2])/float(texsrc[3]);
            //texsrc[3]=(float)255.0;
            texsrc[3]=(float)(texsrc[3] ? 255.0:0.0);
            cumul.at<Vec4f>(row,col)=texsrc;
        }
    imwrite("cumul.png",cumul);

    return 0;
}